

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

char * __thiscall FIX::double_conversion::StringBuilder::Finalize(StringBuilder *this)

{
  int index;
  char *pcVar1;
  size_t sVar2;
  
  index = this->position_;
  if ((-1 < index) && (index < (this->buffer_).length_)) {
    pcVar1 = Vector<char>::operator[](&this->buffer_,index);
    *pcVar1 = '\0';
    pcVar1 = (this->buffer_).start_;
    sVar2 = strlen(pcVar1);
    if (sVar2 == (long)this->position_) {
      this->position_ = -1;
      return pcVar1;
    }
    __assert_fail("strlen(buffer_.start()) == static_cast<size_t>(position_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0x116,"char *FIX::double_conversion::StringBuilder::Finalize()");
  }
  __assert_fail("!is_finalized() && position_ < buffer_.length()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0x112,"char *FIX::double_conversion::StringBuilder::Finalize()");
}

Assistant:

bool is_finalized() const { return position_ < 0; }